

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radefs_p.h
# Opt level: O0

int __thiscall asmjit::_abi_1_10::RATiedReg::init(RATiedReg *this,EVP_PKEY_CTX *ctx)

{
  RegMask in_ECX;
  RATiedFlags in_EDX;
  uint8_t in_R8B;
  uint32_t in_R9D;
  RegMask in_stack_00000008;
  uint8_t in_stack_00000010;
  uint32_t in_stack_00000018;
  uint8_t in_stack_00000020;
  uint32_t in_stack_00000028;
  uint32_t useRewriteMask_local;
  uint32_t useId_local;
  RegMask useRegMask_local;
  RATiedFlags flags_local;
  uint32_t workId_local;
  RATiedReg *this_local;
  
  this->_workId = (uint32_t)ctx;
  this->_consecutiveParent = in_stack_00000028;
  this->_flags = in_EDX;
  (this->field_3).field_0._refCount = '\x01';
  (this->field_3).field_0._rmSize = in_stack_00000020;
  (this->field_3).field_0._useId = in_R8B;
  (this->field_3).field_0._outId = in_stack_00000010;
  this->_useRegMask = in_ECX;
  this->_outRegMask = in_stack_00000008;
  this->_useRewriteMask = in_R9D;
  this->_outRewriteMask = in_stack_00000018;
  return (int)this;
}

Assistant:

inline void init(uint32_t workId, RATiedFlags flags, RegMask useRegMask, uint32_t useId, uint32_t useRewriteMask, RegMask outRegMask, uint32_t outId, uint32_t outRewriteMask, uint32_t rmSize = 0, uint32_t consecutiveParent = Globals::kInvalidId) noexcept {
    _workId = workId;
    _consecutiveParent = consecutiveParent;
    _flags = flags;
    _refCount = 1;
    _rmSize = uint8_t(rmSize);
    _useId = uint8_t(useId);
    _outId = uint8_t(outId);
    _useRegMask = useRegMask;
    _outRegMask = outRegMask;
    _useRewriteMask = useRewriteMask;
    _outRewriteMask = outRewriteMask;
  }